

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampParameterTextureBorderColor.cpp
# Opt level: O0

void __thiscall
glcts::TextureBorderClampParameterTextureBorderColor::initTest
          (TextureBorderClampParameterTextureBorderColor *this)

{
  NotSupportedError *this_00;
  value_type_conflict4 local_30 [8];
  TextureBorderClampParameterTextureBorderColor *local_10;
  TextureBorderClampParameterTextureBorderColor *this_local;
  
  local_10 = this;
  if (((this->super_TextureBorderClampBase).super_TestCaseBase.m_is_texture_border_clamp_supported &
      1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Texture border clamp functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampParameterTextureBorderColor.cpp"
               ,99);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  local_30[4] = 0xde1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->m_texture_targets,local_30 + 4);
  local_30[3] = 0x8c1a;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->m_texture_targets,local_30 + 3);
  local_30[2] = 0x806f;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->m_texture_targets,local_30 + 2);
  local_30[1] = 0x8513;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->m_texture_targets,local_30 + 1);
  if (((this->super_TextureBorderClampBase).super_TestCaseBase.m_is_texture_cube_map_array_supported
      & 1U) != 0) {
    local_30[0] = 0x9009;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->m_texture_targets,local_30);
  }
  return;
}

Assistant:

void TextureBorderClampParameterTextureBorderColor::initTest(void)
{
	/* Check whether GL_EXT_texture_border_clamp is supported */
	if (!m_is_texture_border_clamp_supported)
	{
		throw tcu::NotSupportedError(TEXTURE_BORDER_CLAMP_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Fill array with texture targets used in the test */
	m_texture_targets.push_back(GL_TEXTURE_2D);
	m_texture_targets.push_back(GL_TEXTURE_2D_ARRAY);
	m_texture_targets.push_back(GL_TEXTURE_3D);
	m_texture_targets.push_back(GL_TEXTURE_CUBE_MAP);

	/* Also consider GL_TEXTURE_CUBE_MAP_ARRAY_EXT, but only if
	 * GL_EXT_texture_cube_map_array is supported
	 */
	if (m_is_texture_cube_map_array_supported)
	{
		m_texture_targets.push_back(GL_TEXTURE_CUBE_MAP_ARRAY);
	}
}